

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O2

void __thiscall
btSingleRayCallback::btSingleRayCallback
          (btSingleRayCallback *this,btVector3 *rayFromWorld,btVector3 *rayToWorld,
          btCollisionWorld *world,RayResultCallback *resultCallback)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  btMatrix3x3 *pbVar4;
  btVector3 *pbVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  btVector3 bVar12;
  btVector3 rayDir;
  btVector3 local_30;
  
  (this->super_btBroadphaseRayCallback).super_btBroadphaseAabbCallback.
  _vptr_btBroadphaseAabbCallback = (_func_int **)&PTR__btBroadphaseAabbCallback_001ecce0;
  uVar1 = *(undefined8 *)rayFromWorld->m_floats;
  uVar2 = *(undefined8 *)(rayFromWorld->m_floats + 2);
  *(undefined8 *)(this->m_rayFromWorld).m_floats = uVar1;
  *(undefined8 *)((this->m_rayFromWorld).m_floats + 2) = uVar2;
  uVar3 = *(undefined8 *)(rayToWorld->m_floats + 2);
  *(undefined8 *)(this->m_rayToWorld).m_floats = *(undefined8 *)rayToWorld->m_floats;
  *(undefined8 *)((this->m_rayToWorld).m_floats + 2) = uVar3;
  this->m_world = world;
  this->m_resultCallback = resultCallback;
  (this->m_rayFromTrans).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar4 = &(this->m_rayFromTrans).m_basis;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_rayFromTrans).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_rayFromTrans).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar5 = (this->m_rayFromTrans).m_basis.m_el;
  pbVar5[1].m_floats[2] = 0.0;
  pbVar5[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_rayFromTrans).m_basis;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  pbVar5 = (this->m_rayFromTrans).m_basis.m_el;
  pbVar5[2].m_floats[2] = 1.0;
  pbVar5[2].m_floats[3] = 0.0;
  *(undefined8 *)(this->m_rayFromTrans).m_origin.m_floats = uVar1;
  *(undefined8 *)((this->m_rayFromTrans).m_origin.m_floats + 2) = uVar2;
  (this->m_rayToTrans).m_basis.m_el[0].m_floats[0] = 1.0;
  pbVar4 = &(this->m_rayToTrans).m_basis;
  pbVar4->m_el[0].m_floats[1] = 0.0;
  pbVar4->m_el[0].m_floats[2] = 0.0;
  *(undefined8 *)((this->m_rayToTrans).m_basis.m_el[0].m_floats + 3) = 0;
  (this->m_rayToTrans).m_basis.m_el[1].m_floats[1] = 1.0;
  pbVar5 = (this->m_rayToTrans).m_basis.m_el;
  pbVar5[1].m_floats[2] = 0.0;
  pbVar5[1].m_floats[3] = 0.0;
  pbVar4 = &(this->m_rayToTrans).m_basis;
  pbVar4->m_el[2].m_floats[0] = 0.0;
  pbVar4->m_el[2].m_floats[1] = 0.0;
  pbVar5 = (this->m_rayToTrans).m_basis.m_el;
  pbVar5[2].m_floats[2] = 1.0;
  pbVar5[2].m_floats[3] = 0.0;
  uVar1 = *(undefined8 *)((this->m_rayToWorld).m_floats + 2);
  *(undefined8 *)(this->m_rayToTrans).m_origin.m_floats =
       *(undefined8 *)(this->m_rayToWorld).m_floats;
  *(undefined8 *)((this->m_rayToTrans).m_origin.m_floats + 2) = uVar1;
  local_30 = operator-(rayToWorld,rayFromWorld);
  btVector3::normalize(&local_30);
  bVar12.m_floats = local_30.m_floats;
  auVar10._8_8_ = 0;
  auVar10._0_4_ = local_30.m_floats[0];
  auVar10._4_4_ = local_30.m_floats[1];
  auVar10 = divps(_DAT_001af400,auVar10);
  uVar6 = -(uint)(bVar12.m_floats[0] == 0.0);
  uVar7 = -(uint)(bVar12.m_floats[1] == 0.0);
  fVar8 = (float)(uVar6 & 0x5d5e0b6b | ~uVar6 & auVar10._0_4_);
  fVar9 = (float)(uVar7 & 0x5d5e0b6b | ~uVar7 & auVar10._4_4_);
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[0] = fVar8;
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[1] = fVar9;
  local_30.m_floats[2] = bVar12.m_floats[2];
  fVar11 = (float)(-(uint)(local_30.m_floats[2] == 0.0) & 0x5d5e0b6b |
                  ~-(uint)(local_30.m_floats[2] == 0.0) & (uint)(1.0 / local_30.m_floats[2]));
  (this->super_btBroadphaseRayCallback).m_rayDirectionInverse.m_floats[2] = fVar11;
  *(ulong *)(this->super_btBroadphaseRayCallback).m_signs =
       CONCAT44(-(uint)(fVar9 < 0.0),-(uint)(fVar8 < 0.0)) & 0x100000001;
  (this->super_btBroadphaseRayCallback).m_signs[2] = (uint)(fVar11 < 0.0);
  local_30.m_floats = bVar12.m_floats;
  bVar12 = operator-(&this->m_rayToWorld,&this->m_rayFromWorld);
  (this->super_btBroadphaseRayCallback).m_lambda_max =
       bVar12.m_floats[2] * local_30.m_floats[2] +
       local_30.m_floats[0] * bVar12.m_floats[0] + bVar12.m_floats[1] * local_30.m_floats[1];
  return;
}

Assistant:

btSingleRayCallback(const btVector3& rayFromWorld,const btVector3& rayToWorld,const btCollisionWorld* world,btCollisionWorld::RayResultCallback& resultCallback)
		:m_rayFromWorld(rayFromWorld),
		m_rayToWorld(rayToWorld),
		m_world(world),
		m_resultCallback(resultCallback)
	{
		m_rayFromTrans.setIdentity();
		m_rayFromTrans.setOrigin(m_rayFromWorld);
		m_rayToTrans.setIdentity();
		m_rayToTrans.setOrigin(m_rayToWorld);

		btVector3 rayDir = (rayToWorld-rayFromWorld);

		rayDir.normalize ();
		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		m_rayDirectionInverse[0] = rayDir[0] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[0];
		m_rayDirectionInverse[1] = rayDir[1] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[1];
		m_rayDirectionInverse[2] = rayDir[2] == btScalar(0.0) ? btScalar(BT_LARGE_FLOAT) : btScalar(1.0) / rayDir[2];
		m_signs[0] = m_rayDirectionInverse[0] < 0.0;
		m_signs[1] = m_rayDirectionInverse[1] < 0.0;
		m_signs[2] = m_rayDirectionInverse[2] < 0.0;

		m_lambda_max = rayDir.dot(m_rayToWorld-m_rayFromWorld);

	}